

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence_helpers.cpp
# Opt level: O0

set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
* __thiscall
spvtools::opt::LoopDependenceAnalysis::CollectLoops
          (set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
           *__return_storage_ptr__,LoopDependenceAnalysis *this,
          vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
          *recurrent_nodes)

{
  bool bVar1;
  reference ppSVar2;
  Loop *local_40;
  __normal_iterator<spvtools::opt::SERecurrentNode_*const_*,_std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>_>
  local_38;
  __normal_iterator<spvtools::opt::SERecurrentNode_*const_*,_std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>_>
  local_30;
  const_iterator recurrent_nodes_it;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  *recurrent_nodes_local;
  LoopDependenceAnalysis *this_local;
  set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
  *loops;
  
  recurrent_nodes_it._M_current._7_1_ = 0;
  memset(__return_storage_ptr__,0,0x30);
  std::
  set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
  ::set(__return_storage_ptr__);
  local_30._M_current =
       (SERecurrentNode **)
       std::
       vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>::
       begin(recurrent_nodes);
  while( true ) {
    local_38._M_current =
         (SERecurrentNode **)
         std::
         vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
         ::end(recurrent_nodes);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    ppSVar2 = __gnu_cxx::
              __normal_iterator<spvtools::opt::SERecurrentNode_*const_*,_std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>_>
              ::operator*(&local_30);
    local_40 = SERecurrentNode::GetLoop(*ppSVar2);
    std::
    set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
    ::insert(__return_storage_ptr__,&local_40);
    __gnu_cxx::
    __normal_iterator<spvtools::opt::SERecurrentNode_*const_*,_std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>_>
    ::operator++(&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<const Loop*> LoopDependenceAnalysis::CollectLoops(
    const std::vector<SERecurrentNode*>& recurrent_nodes) {
  // We don't handle loops with more than one induction variable. Therefore we
  // can identify the number of induction variables by collecting all of the
  // loops the collected recurrent nodes belong to.
  std::set<const Loop*> loops{};
  for (auto recurrent_nodes_it = recurrent_nodes.begin();
       recurrent_nodes_it != recurrent_nodes.end(); ++recurrent_nodes_it) {
    loops.insert((*recurrent_nodes_it)->GetLoop());
  }

  return loops;
}